

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O3

string * __thiscall
m2d::savanna::url::to_string_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  paVar2 = &local_68.field_2;
  pcVar3 = (this->scheme_)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (this->scheme_)._M_string_length);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_78 = *puVar8;
    lStack_70 = plVar6[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar8;
    local_88 = (ulong *)*plVar6;
  }
  local_80 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar3 = (this->host_)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + (this->host_)._M_string_length);
  uVar9 = 0xf;
  if (local_88 != &local_78) {
    uVar9 = local_78;
  }
  if (uVar9 < (ulong)(local_40 + local_80)) {
    uVar9 = 0xf;
    if (local_48 != local_38) {
      uVar9 = local_38[0];
    }
    if ((ulong)(local_40 + local_80) <= uVar9) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_88);
      goto LAB_0013161d;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48);
LAB_0013161d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar4 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar5 = std::__cxx11::string::compare((char *)&this->port_);
  if (iVar5 != 0) {
    port_str_abi_cxx11_(&local_68,this);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x18cc38);
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_78 = *puVar8;
      lStack_70 = puVar7[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *puVar8;
      local_88 = (ulong *)*puVar7;
    }
    local_80 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  pcVar3 = (this->path_)._M_dataplus._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + (this->path_)._M_string_length);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  iVar5 = std::__cxx11::string::compare((char *)&this->query_);
  if (iVar5 != 0) {
    pcVar3 = (this->query_)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + (this->query_)._M_string_length);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x18cb4b);
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_78 = *puVar8;
      lStack_70 = puVar7[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *puVar8;
      local_88 = (ulong *)*puVar7;
    }
    local_80 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)&this->fragment_);
  if (iVar5 != 0) {
    pcVar3 = (this->fragment_)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + (this->fragment_)._M_string_length);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1909b5);
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_78 = *puVar8;
      lStack_70 = puVar7[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *puVar8;
      local_88 = (ulong *)*puVar7;
    }
    local_80 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string()
		{
			std::string str = scheme() + "://" + host();
			if (port_ != "") {
				str += ":" + port_str();
			}
			str += path();

			if (query_ != "") {
				str += "?" + query();
			}
			if (fragment_ != "") {
				str += "#" + fragment();
			}
			return str;
		}